

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O3

bool_t EBML_ElementInfiniteForceSize(ebml_element *Element,filepos_t NewSize)

{
  filepos_t fVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  void *pvVar4;
  
  pvVar4 = Node_GetData((node *)Element,0x100,1);
  if (pvVar4 == (void *)0x0) {
    __assert_fail("!EBML_ElementIsFiniteSize(Element)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                  ,0xbd,"bool_t EBML_ElementInfiniteForceSize(ebml_element *, filepos_t)");
  }
  pvVar4 = Node_GetData((node *)Element,0x100,1);
  if (pvVar4 != (void *)0x0) {
    fVar1 = Element->DataSize;
    uVar3 = Element->SizeLength;
    pvVar4 = Node_GetData((node *)Element,0x100,1);
    uVar2 = EBML_CodedSizeLength(fVar1,uVar3,(ulong)(pvVar4 == (void *)0x0));
    fVar1 = Element->DataSize;
    Element->DataSize = NewSize;
    uVar3 = Element->SizeLength;
    pvVar4 = Node_GetData((node *)Element,0x100,1);
    uVar3 = EBML_CodedSizeLength(NewSize,uVar3,(ulong)(pvVar4 == (void *)0x0));
    if (uVar3 == uVar2) {
      EBML_ElementSetInfiniteSize(Element,1);
      return 1;
    }
    Element->DataSize = fVar1;
  }
  return 0;
}

Assistant:

bool_t EBML_ElementInfiniteForceSize(ebml_element *Element, filepos_t NewSize)
{
    int OldSizeLen;
    filepos_t OldSize;

    assert(!EBML_ElementIsFiniteSize(Element));
    if (EBML_ElementIsFiniteSize(Element))
        return 0;

    OldSizeLen = EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
    OldSize = Element->DataSize;
    Element->DataSize = NewSize;

    if (EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element)) == OldSizeLen)
    {
        EBML_ElementSetInfiniteSize(Element,1);
        return 1;
    }
    Element->DataSize = OldSize;

    return 0;
}